

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotVLines<long_long>(char *label_id,longlong *xs,int count,int offset,int stride)

{
  ImPlotPlot *pIVar1;
  long lVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  bool bVar9;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  ImPlotLimits lims;
  TransformerLinLin local_8c;
  GetterXsYRef<long_long> local_88;
  GetterXsYRef<long_long> local_68;
  ImPlotLimits local_48;
  
  bVar9 = BeginItem(label_id,0);
  if (bVar9) {
    GetPlotLimits(&local_48,-1);
    pIVar8 = GImPlot;
    local_68.YRef = local_48.Y.Min;
    if (count == 0) {
      local_88.Offset = 0;
    }
    else {
      local_88.Offset = (offset % count + count) % count;
    }
    local_88.YRef = local_48.Y.Max;
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      pIVar1 = GImPlot->CurrentPlot;
      iVar10 = 0;
      do {
        lVar2 = *(long *)((long)xs +
                         (long)(((local_88.Offset + iVar10) % count + count) % count) * (long)stride
                         );
        if ((0 < lVar2) || (((pIVar1->XAxis).Flags & 0x20U) == 0)) {
          dVar4 = (double)lVar2;
          dVar6 = (pIVar8->ExtentsX).Min;
          dVar7 = (pIVar8->ExtentsX).Max;
          uVar11 = -(ulong)((double)lVar2 < dVar6);
          uVar12 = -(ulong)(dVar7 < dVar4);
          uVar5 = (ulong)dVar4 & uVar12;
          auVar13._0_8_ = ~uVar11 & (ulong)dVar6;
          auVar13._8_8_ = ~uVar12 & (ulong)dVar7;
          auVar3._8_4_ = (int)uVar5;
          auVar3._0_8_ = (ulong)dVar4 & uVar11;
          auVar3._12_4_ = (int)(uVar5 >> 0x20);
          pIVar8->ExtentsX = (ImPlotRange)(auVar13 | auVar3);
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
    local_88.Xs = xs;
    local_88.Count = count;
    local_88.Stride = stride;
    local_68.Xs = xs;
    local_68.Count = count;
    local_68.Offset = local_88.Offset;
    local_68.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar8->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar8->NextItemData).Colors);
      iVar10 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar10]) {
      case 0:
        local_8c.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXsYRef<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLin>
                  (&local_68,&local_88,&local_8c,DrawList,(pIVar8->NextItemData).LineWeight,col);
        break;
      case 1:
        local_8c.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXsYRef<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLin>
                  (&local_68,&local_88,(TransformerLogLin *)&local_8c,DrawList,
                   (pIVar8->NextItemData).LineWeight,col);
        break;
      case 2:
        local_8c.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXsYRef<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLog>
                  (&local_68,&local_88,(TransformerLinLog *)&local_8c,DrawList,
                   (pIVar8->NextItemData).LineWeight,col);
        break;
      case 3:
        local_8c.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXsYRef<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLog>
                  (&local_68,&local_88,(TransformerLogLog *)&local_8c,DrawList,
                   (pIVar8->NextItemData).LineWeight,col);
      }
    }
    pIVar8 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar8->NextItemData);
    pIVar8->PreviousItem = pIVar8->CurrentItem;
    pIVar8->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotVLines(const char* label_id, const T* xs, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXsYRef<T> get_min(xs,lims.Y.Min,count,offset,stride);
        GetterXsYRef<T> get_max(xs,lims.Y.Max,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointX(get_min(i).x);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}